

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O3

void __thiscall icu_63::VTimeZone::load(VTimeZone *this,VTZReader *reader,UErrorCode *status)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  undefined8 uVar4;
  int8_t iVar5;
  short sVar6;
  uint uVar7;
  int32_t iVar8;
  UVector *pUVar9;
  ssize_t sVar10;
  UnicodeString *pUVar11;
  undefined4 uVar12;
  undefined1 *__nbytes;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *__buf;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  code *this_00;
  size_t size;
  UnicodeString line;
  undefined1 local_c2 [10];
  UnicodeString local_b8;
  undefined1 *local_78;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_38;
  
  this_00 = (code *)reader;
  pUVar9 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)reader);
  __buf = extraout_RDX;
  if (pUVar9 != (UVector *)0x0) {
    this_00 = uprv_deleteUObject_63;
    UVector::UVector(pUVar9,uprv_deleteUObject_63,uhash_compareUnicodeString_63,100,status);
    __buf = extraout_RDX_00;
  }
  this->vtzlines = pUVar9;
  if (U_ZERO_ERROR < *status) {
    return;
  }
  __nbytes = (undefined1 *)&local_b8;
  local_b8.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003f5be0;
  local_b8.fUnion.fStackFields.fLengthAndFlags = 2;
  bVar3 = false;
  local_c2._2_8_ = this;
LAB_0021394c:
  do {
    bVar2 = false;
LAB_0021394e:
    do {
      do {
        do {
          sVar10 = VTZReader::read(reader,(int)this_00,__buf,(size_t)__nbytes);
          sVar6 = (short)sVar10;
          __buf = extraout_RDX_01;
        } while (sVar6 == 0xd);
        uVar7 = (uint)sVar10 & 0xffff;
        if (uVar7 == 0xffff) {
          if (bVar3) {
            local_38 = ICAL_END_VTIMEZONE;
            iVar8 = u_strlen_63((UChar *)ICAL_END_VTIMEZONE);
            size = 0;
            iVar5 = UnicodeString::doCompare(&local_b8,0,iVar8,(UChar *)ICAL_END_VTIMEZONE,0,iVar8);
            local_48 = ICAL_END_VTIMEZONE;
            if (iVar5 == '\0') {
              pUVar9 = *(UVector **)(local_c2._2_8_ + 0x50);
              pUVar11 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,size);
              if (pUVar11 != (UnicodeString *)0x0) {
                UnicodeString::UnicodeString(pUVar11,&local_b8);
              }
              UVector::addElement(pUVar9,pUVar11,status);
LAB_00213bff:
              if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
                parse((VTimeZone *)local_c2._2_8_,status);
                goto LAB_00213c22;
              }
              goto LAB_00213c06;
            }
          }
          if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
            *status = U_INVALID_STATE_ERROR;
          }
LAB_00213c06:
          uVar4 = local_c2._2_8_;
          if (*(UVector **)(local_c2._2_8_ + 0x50) != (UVector *)0x0) {
            (*((*(UVector **)(local_c2._2_8_ + 0x50))->super_UObject)._vptr_UObject[1])();
          }
          *(UVector **)(uVar4 + 0x50) = (UVector *)0x0;
LAB_00213c22:
          UnicodeString::~UnicodeString(&local_b8);
          return;
        }
        if (!bVar2) {
          if (sVar6 != 10) {
            this_00 = (code *)local_c2;
            __nbytes = (undefined1 *)0x1;
            local_c2._0_2_ = sVar6;
            UnicodeString::doAppend(&local_b8,(UChar *)this_00,0,1);
            __buf = extraout_RDX_06;
            goto LAB_0021394c;
          }
          if (bVar3) {
            local_50 = ICAL_END_VTIMEZONE;
            iVar8 = u_strlen_63((UChar *)ICAL_END_VTIMEZONE);
            this_00 = (code *)0x0;
            __nbytes = ICAL_END_VTIMEZONE;
            iVar5 = UnicodeString::doCompare(&local_b8,0,iVar8,(UChar *)ICAL_END_VTIMEZONE,0,iVar8);
            local_60 = ICAL_END_VTIMEZONE;
            bVar3 = true;
            bVar2 = true;
            __buf = extraout_RDX_02;
            if (iVar5 == '\0') {
              pUVar9 = *(UVector **)(local_c2._2_8_ + 0x50);
              pUVar11 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)this_00);
              if (pUVar11 != (UnicodeString *)0x0) {
                UnicodeString::UnicodeString(pUVar11,&local_b8);
              }
              UVector::addElement(pUVar9,pUVar11,status);
              goto LAB_00213bff;
            }
          }
          else {
            local_68 = ICAL_BEGIN_VTIMEZONE;
            iVar8 = u_strlen_63((UChar *)ICAL_BEGIN_VTIMEZONE);
            this_00 = (code *)0x0;
            __nbytes = ICAL_BEGIN_VTIMEZONE;
            iVar5 = UnicodeString::doCompare
                              (&local_b8,0,iVar8,(UChar *)ICAL_BEGIN_VTIMEZONE,0,iVar8);
            local_78 = ICAL_BEGIN_VTIMEZONE;
            bVar3 = false;
            bVar2 = true;
            __buf = extraout_RDX_03;
            if (iVar5 == '\0') {
              pUVar9 = *(UVector **)(local_c2._2_8_ + 0x50);
              this_00 = (code *)UMemory::operator_new((UMemory *)0x40,(size_t)this_00);
              if ((UnicodeString *)this_00 != (UnicodeString *)0x0) {
                UnicodeString::UnicodeString((UnicodeString *)this_00,&local_b8);
              }
              UVector::addElement(pUVar9,this_00,status);
              if (U_ZERO_ERROR < *status) goto LAB_00213c06;
              uVar7 = (ushort)local_b8.fUnion.fStackFields.fLengthAndFlags & 0x1e;
              if ((local_b8.fUnion.fStackFields.fLengthAndFlags & 1U) != 0) {
                uVar7 = 2;
              }
              __nbytes = (undefined1 *)(ulong)uVar7;
              local_b8.fUnion.fStackFields.fLengthAndFlags = (int16_t)uVar7;
              bVar3 = true;
              __buf = extraout_RDX_07;
              goto LAB_0021394c;
            }
          }
          goto LAB_0021394e;
        }
        bVar2 = false;
      } while ((sVar6 == 9) || (uVar7 == 0x20));
      uVar7 = (uint)(ushort)local_b8.fUnion.fStackFields.fLengthAndFlags;
      if (bVar3) {
        uVar12 = local_b8.fUnion.fFields.fLength;
        if (-1 < local_b8.fUnion.fStackFields.fLengthAndFlags) {
          uVar12 = (int)local_b8.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        if (0 < (int)uVar12) {
          pUVar9 = *(UVector **)(local_c2._2_8_ + 0x50);
          this_00 = (code *)UMemory::operator_new((UMemory *)0x40,(size_t)this_00);
          if ((UnicodeString *)this_00 != (UnicodeString *)0x0) {
            UnicodeString::UnicodeString((UnicodeString *)this_00,&local_b8);
          }
          UVector::addElement(pUVar9,this_00,status);
          if (U_ZERO_ERROR < *status) goto LAB_00213c06;
          uVar7 = (uint)(ushort)local_b8.fUnion.fStackFields.fLengthAndFlags;
          __buf = extraout_RDX_04;
        }
      }
      uVar1 = uVar7 & 0x1e;
      if ((uVar7 & 1) != 0) {
        uVar1 = 2;
      }
      __nbytes = (undefined1 *)(ulong)uVar1;
      local_b8.fUnion.fStackFields.fLengthAndFlags = (int16_t)uVar1;
      bVar2 = false;
    } while (sVar6 == 10);
    this_00 = (code *)local_c2;
    __nbytes = (undefined1 *)0x1;
    local_c2._0_2_ = sVar6;
    UnicodeString::doAppend(&local_b8,(UChar *)this_00,0,1);
    __buf = extraout_RDX_05;
  } while( true );
}

Assistant:

void
VTimeZone::load(VTZReader& reader, UErrorCode& status) {
    vtzlines = new UVector(uprv_deleteUObject, uhash_compareUnicodeString, DEFAULT_VTIMEZONE_LINES, status);
    if (U_FAILURE(status)) {
        return;
    }
    UBool eol = FALSE;
    UBool start = FALSE;
    UBool success = FALSE;
    UnicodeString line;

    while (TRUE) {
        UChar ch = reader.read();
        if (ch == 0xFFFF) {
            // end of file
            if (start && line.startsWith(ICAL_END_VTIMEZONE, -1)) {
                vtzlines->addElement(new UnicodeString(line), status);
                if (U_FAILURE(status)) {
                    goto cleanupVtzlines;
                }
                success = TRUE;
            }
            break;
        }
        if (ch == 0x000D) {
            // CR, must be followed by LF according to the definition in RFC2445
            continue;
        }
        if (eol) {
            if (ch != 0x0009 && ch != 0x0020) {
                // NOT followed by TAB/SP -> new line
                if (start) {
                    if (line.length() > 0) {
                        vtzlines->addElement(new UnicodeString(line), status);
                        if (U_FAILURE(status)) {
                            goto cleanupVtzlines;
                        }
                    }
                }
                line.remove();
                if (ch != 0x000A) {
                    line.append(ch);
                }
            }
            eol = FALSE;
        } else {
            if (ch == 0x000A) {
                // LF
                eol = TRUE;
                if (start) {
                    if (line.startsWith(ICAL_END_VTIMEZONE, -1)) {
                        vtzlines->addElement(new UnicodeString(line), status);
                        if (U_FAILURE(status)) {
                            goto cleanupVtzlines;
                        }
                        success = TRUE;
                        break;
                    }
                } else {
                    if (line.startsWith(ICAL_BEGIN_VTIMEZONE, -1)) {
                        vtzlines->addElement(new UnicodeString(line), status);
                        if (U_FAILURE(status)) {
                            goto cleanupVtzlines;
                        }
                        line.remove();
                        start = TRUE;
                        eol = FALSE;
                    }
                }
            } else {
                line.append(ch);
            }
        }
    }
    if (!success) {
        if (U_SUCCESS(status)) {
            status = U_INVALID_STATE_ERROR;
        }
        goto cleanupVtzlines;
    }
    parse(status);
    return;

cleanupVtzlines:
    delete vtzlines;
    vtzlines = NULL;
}